

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O3

void you_aggravate(monst *mtmp)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  level *lev;
  boolean bVar4;
  int iVar5;
  char *pcVar6;
  obj *poVar7;
  
  pcVar6 = noit_mon_nam(mtmp);
  pcVar6 = s_suffix(pcVar6);
  pline("For some reason, %s presence is known to you.",pcVar6);
  cls();
  lev = level;
  cVar1 = mtmp->mx;
  cVar2 = mtmp->my;
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))) {
    iVar5 = (int)mtmp->mnum;
  }
  else {
    iVar5 = display_rng(0x193);
  }
  dbuf_set(lev,(int)cVar1,(int)cVar2,(rm *)0x0,0,0,0,0,0,0,0,iVar5 + 1,0,0);
  display_self();
  pcVar6 = noit_mon_nam(mtmp);
  pline("You feel aggravated at %s.",pcVar6);
  (*windowprocs.win_pause)(P_MAP);
  doredraw();
  bVar4 = unconscious();
  if (bVar4 != '\0') {
    multi = -1;
    nomovemsg = "Aggravated, you are jolted into full consciousness.";
  }
  newsym((int)mtmp->mx,(int)mtmp->my);
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001fdcf0;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001fdc91;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001fdc88;
    }
    else {
LAB_001fdc88:
      if (ublindf == (obj *)0x0) goto LAB_001fdd41;
LAB_001fdc91:
      if (ublindf->oartifact != '\x1d') goto LAB_001fdd41;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))
       && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_001fdcf0;
  }
  else {
    bVar4 = worm_known(level,mtmp);
    if (bVar4 != '\0') {
LAB_001fdcf0:
      uVar3 = *(uint *)&mtmp->field_0x60;
      if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar3 & 0x280) == 0) goto LAB_001fdd32;
      }
      else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001fdd32:
        if ((u._1052_1_ & 0x20) == 0) {
          return;
        }
      }
    }
  }
LAB_001fdd41:
  if (((mtmp->data->mflags1 & 0x10000) != 0) ||
     ((poVar7 = which_armor(mtmp,4), poVar7 != (obj *)0x0 &&
      (poVar7 = which_armor(mtmp,4), poVar7->otyp == 0x4f)))) goto LAB_001fde58;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001fdd93;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001fdd8e;
  }
  else {
LAB_001fdd8e:
    if (ublindf != (obj *)0x0) {
LAB_001fdd93:
      if (ublindf->oartifact == '\x1d') goto LAB_001fde25;
    }
    if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
         (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
         youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) {
      return;
    }
  }
LAB_001fde25:
  if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
     (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar5 < 0x41)) {
    return;
  }
LAB_001fde58:
  if (((u.uprops[0x42].intrinsic == 0) && (u.uprops[0x42].extrinsic == 0)) &&
     (bVar4 = match_warn_of_mon(mtmp), bVar4 == '\0')) {
    map_invisible(mtmp->mx,mtmp->my);
    return;
  }
  return;
}

Assistant:

static void you_aggravate(struct monst *mtmp)
{
	pline("For some reason, %s presence is known to you.",
		s_suffix(noit_mon_nam(mtmp)));
	cls();
	dbuf_set(level, mtmp->mx, mtmp->my, NULL, S_unexplored, 0, 0, 0, 0, 0,
		 0, dbuf_monid(mtmp), 0, 0);
	display_self();
	pline("You feel aggravated at %s.", noit_mon_nam(mtmp));
	win_pause_output(P_MAP);
	doredraw();
	if (unconscious()) {
		multi = -1;
		nomovemsg =
		      "Aggravated, you are jolted into full consciousness.";
	}
	newsym(mtmp->mx,mtmp->my);
	if (!canspotmon(level, mtmp))
	    map_invisible(mtmp->mx, mtmp->my);
}